

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O0

Vec_Wrd_t * Vec_WrdUniqifyHash(Vec_Wrd_t *vData,int nWordSize)

{
  Vec_Wrd_t *pVVar1;
  Vec_Int_t *vDataInt;
  Vec_Int_t *vResInt;
  int nWordSize_local;
  Vec_Wrd_t *vData_local;
  
  vData->nSize = vData->nSize << 1;
  vData->nCap = vData->nCap << 1;
  pVVar1 = (Vec_Wrd_t *)Vec_IntUniqifyHash((Vec_Int_t *)vData,nWordSize << 1);
  vData->nSize = vData->nSize / 2;
  vData->nCap = vData->nCap / 2;
  pVVar1->nSize = pVVar1->nSize / 2;
  pVVar1->nCap = pVVar1->nCap / 2;
  return pVVar1;
}

Assistant:

static inline Vec_Wrd_t * Vec_WrdUniqifyHash( Vec_Wrd_t * vData, int nWordSize )
{
    Vec_Int_t * vResInt;
    Vec_Int_t * vDataInt = (Vec_Int_t *)vData;
    vDataInt->nSize *= 2;
    vDataInt->nCap *= 2;
    vResInt = Vec_IntUniqifyHash( vDataInt, 2 * nWordSize );
    vDataInt->nSize /= 2;
    vDataInt->nCap /= 2;
    vResInt->nSize /= 2;
    vResInt->nCap /= 2;
    return (Vec_Wrd_t *)vResInt;
}